

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_info.cpp
# Opt level: O2

unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> __thiscall
duckdb::LoadInfo::Copy(LoadInfo *this)

{
  LoadType LVar1;
  bool bVar2;
  pointer pLVar3;
  long in_RSI;
  
  make_uniq<duckdb::LoadInfo>();
  pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  ::std::__cxx11::string::_M_assign((string *)&pLVar3->filename);
  pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  ::std::__cxx11::string::_M_assign((string *)&pLVar3->repository);
  LVar1 = *(LoadType *)(in_RSI + 0x78);
  pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  pLVar3->load_type = LVar1;
  bVar2 = *(bool *)(in_RSI + 0x50);
  pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  pLVar3->repo_is_alias = bVar2;
  pLVar3 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  ::std::__cxx11::string::_M_assign((string *)&pLVar3->version);
  return (unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>)
         (unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>)this;
}

Assistant:

unique_ptr<LoadInfo> LoadInfo::Copy() const {
	auto result = make_uniq<LoadInfo>();
	result->filename = filename;
	result->repository = repository;
	result->load_type = load_type;
	result->repo_is_alias = repo_is_alias;
	result->version = version;
	return result;
}